

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveIntegration.h
# Opt level: O3

void __thiscall libchess::Position::make_move(Position *this,Move move)

{
  pointer *ppSVar1;
  pointer pSVar2;
  iterator __position;
  pointer pSVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  Bitboard square_bb;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  State local_68;
  
  uVar9 = local_68._28_4_;
  uVar8 = local_68.captured_pt_.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
          super__Optional_payload_base<libchess::PieceType>._4_4_;
  if ((this->side_to_move_).super_MetaValueType<int>.value_ == 1) {
    this->fullmoves_ = this->fullmoves_ + 1;
  }
  this->ply_ = this->ply_ + 1;
  local_68.castling_rights_.value_ = 0;
  local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Square>._4_4_ =
       local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
       super__Optional_payload_base<libchess::Square>._4_4_ & 0xffffff00;
  local_68.previous_move_.super__Optional_base<libchess::Move,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Move>._M_engaged = false;
  local_68.captured_pt_.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::PieceType>._4_4_ =
       local_68.captured_pt_.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
       super__Optional_payload_base<libchess::PieceType>._4_4_ & 0xffffff00;
  local_68._28_4_ = local_68._28_4_ & 0xffffff00;
  local_68.hash_ = 0;
  local_68.pawn_hash_ = 0;
  local_68.halfmoves_ = 0;
  __position._M_current =
       (this->history_).
       super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->history_).
      super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<libchess::Position::State,_std::allocator<libchess::Position::State>_>::
    _M_realloc_insert<libchess::Position::State>(&this->history_,__position,&local_68);
  }
  else {
    *(ulong *)&(__position._M_current)->halfmoves_ = (ulong)(uint)local_68._52_4_ << 0x20;
    (__position._M_current)->hash_ = 0;
    (__position._M_current)->pawn_hash_ = 0;
    *(ulong *)&((__position._M_current)->previous_move_).
               super__Optional_base<libchess::Move,_true,_true>._M_payload.
               super__Optional_payload_base<libchess::Move>._M_engaged =
         (ulong)(uint7)local_68._17_7_ << 8;
    *(ulong *)&((__position._M_current)->captured_pt_).
               super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
               super__Optional_payload_base<libchess::PieceType>._M_engaged =
         CONCAT44(uVar9,uVar8) & 0xffffff00ffffff00;
    ((__position._M_current)->castling_rights_).value_ = 0;
    ((__position._M_current)->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>.
    _M_payload.super__Optional_payload_base<libchess::Square>._M_payload =
         local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Square>._M_payload;
    ((__position._M_current)->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>.
    _M_payload.super__Optional_payload_base<libchess::Square>._M_engaged =
         local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Square>._M_engaged;
    *(undefined3 *)
     &((__position._M_current)->enpassant_square_).
      super__Optional_base<libchess::Square,_true,_true>._M_payload.
      super__Optional_payload_base<libchess::Square>.field_0x5 =
         local_68.enpassant_square_.super__Optional_base<libchess::Square,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Square>._5_3_;
    ((__position._M_current)->previous_move_).super__Optional_base<libchess::Move,_true,_true>.
    _M_payload.super__Optional_payload_base<libchess::Move>._M_payload =
         local_68.previous_move_.super__Optional_base<libchess::Move,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Move>._M_payload;
    ppSVar1 = &(this->history_).
               super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  lVar11 = (long)this->ply_;
  pSVar3 = (this->history_).
           super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = pSVar3 + lVar11;
  pSVar3[lVar11].halfmoves_ = pSVar3[lVar11 + -1].halfmoves_ + 1;
  if (*(bool *)((long)&pSVar3[lVar11].previous_move_.
                       super__Optional_base<libchess::Move,_true,_true>._M_payload + 4) == false) {
    *(bool *)((long)&(pSVar2->previous_move_).super__Optional_base<libchess::Move,_true,_true>.
                     _M_payload + 4) = true;
  }
  *(value_type *)
   &(pSVar2->previous_move_).super__Optional_base<libchess::Move,_true,_true>._M_payload.
    super__Optional_payload_base<libchess::Move> = move.value_;
  (pSVar2->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Square> = (_Optional_payload_base<libchess::Square>)0x0;
  uVar12 = move.value_ & 0x3f;
  uVar10 = (uint)move.value_ >> 6 & 0x3f;
  uVar18 = 1L << (sbyte)uVar12;
  (pSVar2->castling_rights_).value_ =
       castling_spoilers[uVar12] & pSVar2[-1].castling_rights_.value_ & castling_spoilers[uVar10];
  lVar11 = 0;
  do {
    iVar20 = *(int *)((long)&constants::PIECE_TYPES + lVar11);
    uVar4 = this->piece_type_bb_[iVar20].value_;
    if ((uVar4 & uVar18) != 0) goto LAB_0010dd4f;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x18);
  iVar20 = 0;
LAB_0010dd4f:
  uVar19 = 1L << (sbyte)uVar10;
  lVar11 = 0;
  do {
    lVar16 = (long)*(int *)((long)&constants::PIECE_TYPES + lVar11);
    if ((this->piece_type_bb_[lVar16].value_ & uVar19) != 0) {
      bVar7 = true;
      goto LAB_0010dd82;
    }
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x18);
  lVar16 = 0;
  bVar7 = false;
LAB_0010dd82:
  uVar13 = (uint)move.value_ >> 0xc & 7;
  uVar15 = (uint)move.value_ >> 0xf & 7;
  if (((uint)move.value_ >> 0xf & 7) == 0) {
    lVar11 = 0;
    do {
      iVar17 = *(int *)((long)&constants::PIECE_TYPES + lVar11);
      uVar5 = this->piece_type_bb_[iVar17].value_;
      if ((uVar5 & uVar18) != 0) goto LAB_0010de02;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x18);
    iVar17 = 0;
LAB_0010de02:
    lVar11 = 0;
    do {
      uVar6 = this->piece_type_bb_[*(int *)((long)&constants::PIECE_TYPES + lVar11)].value_;
      if ((uVar6 & uVar19) != 0) break;
      bVar21 = lVar11 != 0x14;
      lVar11 = lVar11 + 4;
    } while (bVar21);
    if ((uVar13 == 0) || (uVar13 == 5)) {
      uVar15 = 6;
      if ((uVar6 & uVar19) == 0) {
        if (iVar17 == 0 && (uVar5 & uVar18) != 0) {
          iVar14 = uVar10 - uVar12;
          iVar17 = -iVar14;
          if (0 < iVar14) {
            iVar17 = iVar14;
          }
          if ((iVar17 == 7) || (iVar17 == 9)) {
            uVar15 = 3;
            goto LAB_0010dd93;
          }
          uVar15 = 5;
          if (iVar17 == 0x10) goto LAB_0010dd93;
        }
        else if ((iVar17 == 5 && (uVar5 & uVar18) != 0) &&
                (uVar15 = 2, ((uVar10 - uVar12) + 2 & 0xfffffffb) == 0)) goto LAB_0010dd93;
        uVar15 = 1;
      }
    }
    else {
      uVar15 = (uint)((uVar6 & uVar19) != 0) * 3 + 4;
    }
  }
LAB_0010dd93:
  if (((uVar4 & uVar18) != 0 && iVar20 == 0) || (bVar7)) {
    pSVar2->halfmoves_ = 0;
  }
  (*(code *)((long)&DAT_00115080 + (long)(int)(&DAT_00115080)[uVar15 - 1]))
            (&DAT_00115080,lVar16,
             (code *)((long)&DAT_00115080 + (long)(int)(&DAT_00115080)[uVar15 - 1]));
  return;
}

Assistant:

inline void Position::make_move(Move move) {
    Color stm = side_to_move();
    if (stm == constants::BLACK) {
        ++fullmoves_;
    }
    ++ply_;
    history_.push_back(State{});
    State& prev_state = state_mut_ref(ply_ - 1);
    State& next_state = state_mut_ref();
    next_state.halfmoves_ = prev_state.halfmoves_ + 1;
    next_state.previous_move_ = move;
    next_state.enpassant_square_ = {};

    Square from_square = move.from_square();
    Square to_square = move.to_square();

    next_state.castling_rights_ = CastlingRights{prev_state.castling_rights_.value() &
                                                 castling_spoilers[from_square.value()] &
                                                 castling_spoilers[to_square.value()]};

    auto moving_pt = piece_type_on(from_square);
    auto captured_pt = piece_type_on(to_square);
    auto promotion_pt = move.promotion_piece_type();

    Move::Type move_type = move_type_of(move);

    if (moving_pt == constants::PAWN || captured_pt) {
        next_state.halfmoves_ = 0;
    }

    switch (move_type) {
    case Move::Type::NORMAL:
        move_piece(from_square, to_square, *moving_pt, stm);
        break;
    case Move::Type::CAPTURE:
        remove_piece(to_square, *captured_pt, !stm);
        move_piece(from_square, to_square, *moving_pt, stm);
        break;
    case Move::Type::DOUBLE_PUSH:
        move_piece(from_square, to_square, constants::PAWN, stm);
        next_state.enpassant_square_ =
            stm == constants::WHITE ? Square(from_square + 8) : Square(from_square - 8);
        break;
    case Move::Type::ENPASSANT:
        move_piece(from_square, to_square, constants::PAWN, stm);
        remove_piece(stm == constants::WHITE ? Square(to_square - 8) : Square(to_square + 8),
                     constants::PAWN, !stm);
        break;
    case Move::Type::CASTLING:
        move_piece(from_square, to_square, constants::KING, stm);
        switch (to_square) {
        case constants::C1:
            move_piece(constants::A1, constants::D1, constants::ROOK, stm);
            break;
        case constants::G1:
            move_piece(constants::H1, constants::F1, constants::ROOK, stm);
            break;
        case constants::C8:
            move_piece(constants::A8, constants::D8, constants::ROOK, stm);
            break;
        case constants::G8:
            move_piece(constants::H8, constants::F8, constants::ROOK, stm);
            break;
        default:
            break;
        }
        break;
    case Move::Type::PROMOTION:
        remove_piece(from_square, constants::PAWN, stm);
        put_piece(to_square, *promotion_pt, stm);
        break;
    case Move::Type::CAPTURE_PROMOTION:
        remove_piece(to_square, *captured_pt, !stm);
        remove_piece(from_square, constants::PAWN, stm);
        put_piece(to_square, *promotion_pt, stm);
        break;
    case Move::Type::NONE:
        break;
    }
    next_state.captured_pt_ = captured_pt;
    next_state.move_type_ = move_type;
    reverse_side_to_move();
    next_state.hash_ = calculate_hash();
    next_state.pawn_hash_ = calculate_pawn_hash();
}